

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O2

void __thiscall smf::MidiEventList::removeEmpties(MidiEventList *this)

{
  pointer ppMVar1;
  MidiEvent *this_00;
  pointer ppMVar2;
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *__range1;
  int iVar3;
  MidiEvent **item_1;
  pointer ppMVar4;
  MidiEvent **item;
  _Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> local_48;
  
  ppMVar1 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  iVar3 = 0;
  for (ppMVar4 = (this->list).
                 super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppMVar4 != ppMVar1; ppMVar4 = ppMVar4 + 1) {
    this_00 = *ppMVar4;
    if ((this_00->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this_00->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      MidiEvent::~MidiEvent(this_00);
      operator_delete(this_00);
      *ppMVar4 = (MidiEvent *)0x0;
      iVar3 = iVar3 + 1;
    }
  }
  if (iVar3 != 0) {
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::reserve
              ((vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)&local_48,
               ((long)(this->list).
                      super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->list).
                      super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) - (long)iVar3);
    ppMVar1 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppMVar4 = (this->list).
                   super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppMVar4 != ppMVar1; ppMVar4 = ppMVar4 + 1) {
      if (*ppMVar4 != (value_type)0x0) {
        std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::push_back
                  ((vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)&local_48,ppMVar4)
        ;
      }
    }
    ppMVar4 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
    ppMVar1 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppMVar2 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
    super__Vector_impl_data._M_start = local_48._M_impl.super__Vector_impl_data._M_start;
    (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
    super__Vector_impl_data._M_finish = local_48._M_impl.super__Vector_impl_data._M_finish;
    local_48._M_impl.super__Vector_impl_data._M_start = ppMVar1;
    local_48._M_impl.super__Vector_impl_data._M_finish = ppMVar2;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = ppMVar4;
    std::_Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::~_Vector_base(&local_48)
    ;
  }
  return;
}

Assistant:

void MidiEventList::removeEmpties(void) {
	int count = 0;
	for (auto& item : list) {
		if (item->empty()) {
			delete item;
			item = NULL;
			count++;
		}
	}
	if (count == 0) {
		return;
	}
	std::vector<MidiEvent*> newlist;
	newlist.reserve(list.size() - count);
	for (auto& item : list) {
		if (item) {
			newlist.push_back(item);
		}
	}
	list.swap(newlist);
}